

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
CompilerIdNode::EvaluateWithLanguage
          (string *__return_storage_ptr__,CompilerIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4,string *lang)

{
  GeneratorExpressionContent *context_00;
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  cmMakefile *this_00;
  string *psVar4;
  const_reference s;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  cmake *this_01;
  PolicyID id;
  char *local_2d8;
  allocator<char> local_292;
  allocator<char> local_291;
  string local_290;
  string local_270;
  undefined1 local_250 [8];
  ostringstream e;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  string *compilerId;
  cmGeneratorExpressionDAGChecker *param_5_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  CompilerIdNode *this_local;
  
  compilerId = (string *)param_4;
  param_5_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (CompilerIdNode *)__return_storage_ptr__;
  this_00 = cmLocalGenerator::GetMakefile(context->LG);
  std::operator+(&local_80,"CMAKE_",lang);
  std::operator+(&local_60,&local_80,"_COMPILER_ID");
  psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  local_40 = psVar4;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)context_local);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
    return __return_storage_ptr__;
  }
  if ((EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
       ::compilerIdValidator == '\0') &&
     (iVar2 = __cxa_guard_acquire(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                                   ::compilerIdValidator), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&EvaluateWithLanguage::compilerIdValidator,"^[A-Za-z0-9_]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 &EvaluateWithLanguage::compilerIdValidator,&__dso_handle);
    __cxa_guard_release(&EvaluateWithLanguage(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*,std::__cxx11::string_const&)
                         ::compilerIdValidator);
  }
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context_local);
  bVar1 = cmsys::RegularExpression::find(&EvaluateWithLanguage::compilerIdValidator,s);
  context_00 = content_local;
  if (!bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)param_5_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Expression syntax not recognized.",&local_d1);
    reportError((cmGeneratorExpressionContext *)context_00,&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)context_local);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      local_2d8 = "0";
    }
    else {
      local_2d8 = "1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_2d8,&local_d2);
    std::allocator<char>::~allocator(&local_d2);
    return __return_storage_ptr__;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)context_local);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar6,pcVar7);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1",&local_d3);
    std::allocator<char>::~allocator(&local_d3);
    return __return_storage_ptr__;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)context_local);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar2 = cmsysString_strcasecmp(pcVar6,pcVar7);
  if (iVar2 == 0) {
    PVar3 = cmLocalGenerator::GetPolicyStatus
                      ((cmLocalGenerator *)
                       content_local[3].ParamChildren.
                       super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,CMP0044);
    if (PVar3 != OLD) {
      if (PVar3 != WARN) goto LAB_0057bd79;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_270,(cmPolicies *)0x2c,id);
      std::operator<<((ostream *)local_250,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this_01 = cmLocalGenerator::GetCMakeInstance
                          ((cmLocalGenerator *)
                           content_local[3].ParamChildren.
                           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_290,(cmListFileBacktrace *)content_local);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"1",&local_291);
    std::allocator<char>::~allocator(&local_291);
  }
  else {
LAB_0057bd79:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"0",&local_292);
    std::allocator<char>::~allocator(&local_292);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateWithLanguage(const std::vector<std::string>& parameters,
                                   cmGeneratorExpressionContext* context,
                                   const GeneratorExpressionContent* content,
                                   cmGeneratorExpressionDAGChecker* /*unused*/,
                                   const std::string& lang) const
  {
    std::string const& compilerId =
      context->LG->GetMakefile()->GetSafeDefinition("CMAKE_" + lang +
                                                    "_COMPILER_ID");
    if (parameters.empty()) {
      return compilerId;
    }
    static cmsys::RegularExpression compilerIdValidator("^[A-Za-z0-9_]*$");
    if (!compilerIdValidator.find(parameters.front())) {
      reportError(context, content->GetOriginalExpression(),
                  "Expression syntax not recognized.");
      return std::string();
    }
    if (compilerId.empty()) {
      return parameters.front().empty() ? "1" : "0";
    }

    if (strcmp(parameters.front().c_str(), compilerId.c_str()) == 0) {
      return "1";
    }

    if (cmsysString_strcasecmp(parameters.front().c_str(),
                               compilerId.c_str()) == 0) {
      switch (context->LG->GetPolicyStatus(cmPolicies::CMP0044)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0044);
          context->LG->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e.str(), context->Backtrace);
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          return "1";
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
      }
    }
    return "0";
  }